

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

void encode_message(upb_encstate *e,upb_Message *msg,upb_MiniTable *m,size_t *size)

{
  upb_MiniTableField *field;
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 *puVar5;
  upb_MiniTableField *puVar6;
  upb_MessageValue ext_val;
  ulong uVar7;
  upb_Message_Internal *in;
  uint *puVar8;
  long lVar9;
  ulong uVar10;
  ulong bytes;
  ulong uVar11;
  upb_MiniTableExtension *puVar12;
  char *__dest;
  upb_MiniTableExtension *unaff_RBP;
  upb_MiniTableExtension *puVar13;
  void *__src;
  upb_Message_Internal *in_00;
  size_t __n;
  ulong uVar14;
  long lVar15;
  long *plVar16;
  ulong *puVar17;
  bool bVar18;
  _upb_sortedmap sorted;
  _upb_sortedmap local_64;
  char *local_58;
  ulong local_50;
  ulong local_48;
  char *local_40;
  size_t *local_38;
  
  local_58 = e->ptr;
  local_40 = e->limit;
  if (((e->options & 4U) != 0) &&
     (bVar1 = m->required_count_dont_copy_me__upb_internal_use_only, bVar1 != 0)) {
    if (0x40 < bVar1) {
      __assert_fail("0 < n && n <= 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                    ,0xb3,
                    "uint64_t _upb_MiniTable_RequiredMask_dont_copy_me__upb_internal_use_only(const struct upb_MiniTable *)"
                   );
    }
    if ((-1L << (bVar1 & 0x3f) | msg[1].field_0.internal_opaque) != 0xffffffffffffffff) {
      encode_err(e,kUpb_EncodeStatus_MissingRequired);
    }
  }
  local_38 = size;
  if ((e->options & 2U) == 0) {
    puVar8 = (uint *)((msg->field_0).internal_opaque & 0xfffffffffffffffe);
    uVar14 = 0;
    uVar10 = 0;
    do {
      bytes = uVar10;
      if (puVar8 == (uint *)0x0) {
LAB_004fb4eb:
        lVar15 = 0;
        bVar18 = false;
      }
      else {
        uVar11 = (ulong)*puVar8;
        uVar10 = uVar14;
        uVar7 = uVar11;
        if (uVar11 < uVar14) {
          uVar7 = uVar14;
        }
        do {
          uVar14 = uVar7;
          if (uVar11 <= uVar10) goto LAB_004fb4eb;
          uVar4 = *(ulong *)(puVar8 + uVar10 * 2 + 2);
          uVar10 = uVar10 + 1;
          uVar7 = uVar14;
        } while ((uVar4 & 1) != 0 || uVar4 == 0);
        lVar15 = *(long *)((uVar4 & 0xfffffffffffffffc) + 8);
        bVar18 = true;
        uVar14 = uVar10;
      }
      uVar10 = lVar15 + bytes;
    } while (bVar18);
    if (bytes != 0) {
      if ((ulong)((long)local_58 - (long)e->buf) < bytes) {
        encode_growbuffer(e,bytes);
      }
      else {
        e->ptr = local_58 + -bytes;
      }
      __dest = e->ptr;
      puVar13 = (upb_MiniTableExtension *)0x0;
      do {
        puVar8 = (uint *)((msg->field_0).internal_opaque & 0xfffffffffffffffe);
        unaff_RBP = puVar13;
        if (puVar8 == (uint *)0x0) {
LAB_004fb586:
          __n = 0;
          __src = (void *)0x0;
          bVar18 = false;
        }
        else {
          puVar12 = (upb_MiniTableExtension *)(ulong)*puVar8;
          unaff_RBP = puVar12;
          if (puVar12 < puVar13) {
            unaff_RBP = puVar13;
          }
          do {
            if (puVar12 <= puVar13) goto LAB_004fb586;
            uVar14 = *(ulong *)(puVar8 + (long)puVar13 * 2 + 2);
            puVar13 = (upb_MiniTableExtension *)
                      ((long)&(puVar13->field_dont_copy_me__upb_internal_use_only).
                              number_dont_copy_me__upb_internal_use_only + 1);
          } while ((uVar14 & 1) != 0 || uVar14 == 0);
          __src = *(void **)(uVar14 & 0xfffffffffffffffc);
          __n = ((undefined8 *)(uVar14 & 0xfffffffffffffffc))[1];
          bVar18 = true;
          unaff_RBP = puVar13;
        }
        if (!bVar18) break;
        memcpy(__dest,__src,__n);
        __dest = __dest + __n;
        puVar13 = unaff_RBP;
      } while( true );
    }
  }
  if ((m->ext_dont_copy_me__upb_internal_use_only != '\0') &&
     (in_00 = (upb_Message_Internal *)((msg->field_0).internal_opaque & 0xfffffffffffffffe),
     in_00 != (upb_Message_Internal *)0x0)) {
    uVar3 = in_00->size;
    if ((ulong)uVar3 == 0) {
      uVar14 = 0;
      bVar18 = false;
    }
    else {
      unaff_RBP = (upb_MiniTableExtension *)(in_00 + (ulong)(uVar3 - 1) + 1);
      lVar15 = -1;
      do {
        lVar9 = lVar15;
        if (((ulong)in_00[(ulong)(uVar3 - 1) + lVar9 + 2] & 1) != 0) {
          puVar17 = (ulong *)((ulong)in_00[(ulong)(uVar3 - 1) + lVar9 + 2] & 0xfffffffffffffffc);
          switch(*(byte *)(*puVar17 + 0xb) & 3) {
          case 0:
            uVar14 = puVar17[1];
            if (*(char *)(uVar14 + 3) == '\x01') {
              uVar14 = (ulong)*(uint *)(uVar14 + 0x10);
            }
            else {
              uVar14 = upb_inttable_count((upb_inttable *)(uVar14 + 8));
            }
            break;
          case 1:
            uVar14 = *(ulong *)(puVar17[1] + 8);
            break;
          case 2:
            goto switchD_004fb60b_caseD_2;
          case 3:
switchD_004fb60b_caseD_3:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/extension.h"
                          ,0x3f,
                          "_Bool _upb_Extension_IsEmpty_dont_copy_me__upb_internal_use_only(const upb_Extension *)"
                         );
          }
          if (uVar14 != 0) {
switchD_004fb60b_caseD_2:
            unaff_RBP = (upb_MiniTableExtension *)*puVar17;
            local_50 = puVar17[1];
            local_48 = puVar17[2];
            bVar18 = true;
            goto LAB_004fb672;
          }
        }
        lVar15 = lVar9 + -1;
      } while ((ulong)uVar3 + lVar9 != 0);
      bVar18 = false;
LAB_004fb672:
      uVar14 = -lVar9;
    }
    if (bVar18) {
      if ((e->options & 1) == 0) {
        do {
          ext_val.str_val.size = local_48;
          ext_val.double_val = (double)local_50;
          encode_ext(e,unaff_RBP,ext_val,m->ext_dont_copy_me__upb_internal_use_only == '\x02');
          puVar8 = (uint *)((msg->field_0).internal_opaque & 0xfffffffffffffffe);
          if (puVar8 == (uint *)0x0) {
            bVar18 = false;
          }
          else {
            uVar3 = *puVar8;
            if (uVar14 < uVar3) {
              uVar10 = ~uVar14;
              do {
                uVar14 = uVar10;
                if ((*(ulong *)(puVar8 + (ulong)(uVar3 - 1) * 2 + uVar14 * 2 + 4) & 1) != 0) {
                  plVar16 = (long *)(*(ulong *)(puVar8 + (ulong)(uVar3 - 1) * 2 + uVar14 * 2 + 4) &
                                    0xfffffffffffffffc);
                  switch(*(byte *)(*plVar16 + 0xb) & 3) {
                  case 0:
                    lVar15 = plVar16[1];
                    if (*(char *)(lVar15 + 3) == '\x01') {
                      uVar10 = (ulong)*(uint *)(lVar15 + 0x10);
                    }
                    else {
                      uVar10 = upb_inttable_count((upb_inttable *)(lVar15 + 8));
                    }
                    break;
                  case 1:
                    uVar10 = *(ulong *)(plVar16[1] + 8);
                    break;
                  case 2:
                    goto switchD_004fb716_caseD_2;
                  case 3:
                    goto switchD_004fb60b_caseD_3;
                  }
                  if (uVar10 != 0) {
switchD_004fb716_caseD_2:
                    unaff_RBP = (upb_MiniTableExtension *)*plVar16;
                    local_50 = plVar16[1];
                    local_48 = plVar16[2];
                    uVar14 = -uVar14;
                    bVar18 = true;
                    goto LAB_004fb796;
                  }
                }
                uVar10 = uVar14 - 1;
              } while ((uVar14 - 1) + (ulong)uVar3 != -1);
              uVar14 = -uVar14;
            }
            bVar18 = false;
          }
LAB_004fb796:
        } while (bVar18);
      }
      else {
        _upb_mapsorter_pushexts(&e->sorter,in_00,&local_64);
        while (lVar15 = (long)local_64.pos, local_64.pos != local_64.end) {
          local_64.pos = local_64.pos + 1;
          puVar5 = (undefined8 *)(e->sorter).entries[lVar15];
          encode_ext(e,(upb_MiniTableExtension *)*puVar5,*(upb_MessageValue *)(puVar5 + 1),
                     m->ext_dont_copy_me__upb_internal_use_only == '\x02');
        }
        (e->sorter).size = local_64.start;
      }
    }
  }
  if (m->field_count_dont_copy_me__upb_internal_use_only != 0) {
    puVar6 = m->fields_dont_copy_me__upb_internal_use_only;
    lVar15 = (ulong)m->field_count_dont_copy_me__upb_internal_use_only * 0xc;
    do {
      field = (upb_MiniTableField *)
              ((long)&puVar6[-1].number_dont_copy_me__upb_internal_use_only + lVar15);
      uVar2 = *(ushort *)((long)puVar6 + lVar15 + -6);
      if (uVar2 == 0) {
        (*(code *)(&DAT_00723130 +
                  *(int *)(&DAT_00723130 + (ulong)(*(byte *)((long)puVar6 + lVar15 + -1) >> 6) * 4))
        )();
        return;
      }
      if ((short)uVar2 < 1) {
        if (-1 < (short)uVar2) {
          __assert_fail("upb_MiniTableField_IsInOneof(f)",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                        ,0xbd,
                        "size_t _upb_MiniTableField_OneofOffset_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                       );
        }
        bVar18 = *(uint32_t *)((long)&msg->field_0 + (ulong)(uVar2 ^ 0xffff)) ==
                 field->number_dont_copy_me__upb_internal_use_only;
      }
      else {
        bVar18 = (*(byte *)((long)&msg->field_0 + (ulong)(uVar2 >> 3)) >> (uVar2 & 7) & 1) != 0;
      }
      if (bVar18) {
        encode_field(e,msg,m->subs_dont_copy_me__upb_internal_use_only,field);
      }
      lVar15 = lVar15 + -0xc;
    } while (lVar15 != 0);
  }
  *local_38 = (long)(local_58 + (long)e->limit) - (long)(local_40 + (long)e->ptr);
  return;
}

Assistant:

static void encode_message(upb_encstate* e, const upb_Message* msg,
                           const upb_MiniTable* m, size_t* size) {
  size_t pre_len = e->limit - e->ptr;

  if (e->options & kUpb_EncodeOption_CheckRequired) {
    if (m->UPB_PRIVATE(required_count)) {
      if (!UPB_PRIVATE(_upb_Message_IsInitializedShallow)(msg, m)) {
        encode_err(e, kUpb_EncodeStatus_MissingRequired);
      }
    }
  }

  if ((e->options & kUpb_EncodeOption_SkipUnknown) == 0) {
    size_t unknown_size = 0;
    uintptr_t iter = kUpb_Message_UnknownBegin;
    upb_StringView unknown;
    // Need to write in reverse order, but iteration is in-order; scan to
    // reserve capacity up front, then write in-order
    while (upb_Message_NextUnknown(msg, &unknown, &iter)) {
      unknown_size += unknown.size;
    }
    if (unknown_size != 0) {
      encode_reserve(e, unknown_size);
      char* ptr = e->ptr;
      iter = kUpb_Message_UnknownBegin;
      while (upb_Message_NextUnknown(msg, &unknown, &iter)) {
        memcpy(ptr, unknown.data, unknown.size);
        ptr += unknown.size;
      }
    }
  }

  encode_exts(e, m, msg);

  if (upb_MiniTable_FieldCount(m)) {
    const upb_MiniTableField* f =
        &m->UPB_PRIVATE(fields)[m->UPB_PRIVATE(field_count)];
    const upb_MiniTableField* first = &m->UPB_PRIVATE(fields)[0];
    while (f != first) {
      f--;
      if (encode_shouldencode(e, msg, f)) {
        encode_field(e, msg, m->UPB_PRIVATE(subs), f);
      }
    }
  }

  *size = (e->limit - e->ptr) - pre_len;
}